

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O2

void __thiscall Network::check_consistency(Network *this)

{
  pointer psVar1;
  uint uVar2;
  undefined8 in_RAX;
  size_type sVar3;
  _Base_ptr p_Var4;
  undefined8 uStack_28;
  
  uVar2 = 0;
  uStack_28 = in_RAX;
  do {
    uStack_28 = CONCAT44(uVar2,(undefined4)uStack_28);
    if ((uint)((ulong)((long)(this->node_list).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->node_list).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2) <= uVar2) {
      return;
    }
    psVar1 = (this->links).
             super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (p_Var4 = *(_Base_ptr *)((long)&psVar1[uVar2]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var4 != &psVar1[uVar2]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        ((this->links).
                         super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + p_Var4[1]._M_color,
                         (key_type *)((long)&uStack_28 + 4));
      if (sVar3 != 1) {
        __assert_fail("links[node_j].count(node_i) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/network.h"
                      ,0x5b,"void Network::check_consistency() const");
      }
    }
    uVar2 = uStack_28._4_4_ + 1;
  } while( true );
}

Assistant:

void check_consistency() const {
        for (unsigned int node_i = 0; node_i < getN(); node_i++)
            for(unsigned int node_j : links[node_i])
                assert(links[node_j].count(node_i) == 1);
    }